

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# RecyclerWriteBarrierManager.cpp
# Opt level: O1

void Memory::RecyclerWriteBarrierManager::WriteBarrier(void *address,size_t bytes)

{
  undefined4 *puVar1;
  code *pcVar2;
  bool bVar3;
  ulong uVar4;
  ulong uVar5;
  undefined8 *in_FS_OFFSET;
  
  VerifyIsBarrierAddress(address,bytes);
  uVar4 = (ulong)address >> 0xc;
  uVar5 = (long)address + bytes + 0xfff >> 0xc;
  if (uVar5 < uVar4) {
    AssertCount = AssertCount + 1;
    Js::Throw::LogAssert();
    puVar1 = (undefined4 *)*in_FS_OFFSET;
    *puVar1 = 1;
    bVar3 = Js::Throw::ReportAssert
                      ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Common/Memory/RecyclerWriteBarrierManager.cpp"
                       ,0x16a,"(startIndex <= endIndex)","startIndex <= endIndex");
    if (!bVar3) {
      pcVar2 = (code *)invalidInstructionException();
      (*pcVar2)();
    }
    *puVar1 = 0;
  }
  memset(cardTable + uVar4,3,uVar5 - uVar4);
  if (Js::Configuration::Global[0x291a2] == '\x01') {
    bVar3 = Js::Phases::IsEnabled
                      ((Phases *)(Js::Configuration::Global + 0x23450),MemoryAllocationPhase);
    if (bVar3) {
      Output::Print(L"Writing to 0x%p (CIndex: %u-%u)\n",address,uVar4,uVar5);
      return;
    }
  }
  return;
}

Assistant:

void
RecyclerWriteBarrierManager::WriteBarrier(void * address, size_t bytes)
{
    if (IS_ASAN_FAKE_STACK_ADDR(address))
    {
        return;
    }

#if ENABLE_DEBUG_CONFIG_OPTIONS
    VerifyIsBarrierAddress(address, bytes);
#endif
#ifdef RECYCLER_WRITE_BARRIER_BYTE
    uintptr_t startIndex = GetCardTableIndex(address);
    char * endAddress = (char *)Math::Align<INT_PTR>((INT_PTR)((char *)address + bytes), s_WriteBarrierPageSize);
    uintptr_t endIndex = GetCardTableIndex(endAddress);
    Assert(startIndex <= endIndex);
    memset(cardTable + startIndex, WRITE_BARRIER_PAGE_BIT | DIRTYBIT, endIndex - startIndex);
    GlobalSwbVerboseTrace(_u("Writing to 0x%p (CIndex: %u-%u)\n"), address, startIndex, endIndex);

#else
    uint bitShift = (((uint)address) >> s_BitArrayCardTableShift);
    uint bitMask = 0xFFFFFFFF << bitShift;
    uint cardIndex = ((uint)address) / s_BytesPerCard);

    char * endAddress = (char *)Math::Align((INT_PTR)((char *)address + bytes), s_BytesPerCardBit);
    char * alignedAddress = (char *)Math::Align((INT_PTR)address, s_WriteBarrierPageSize);
    if (alignedAddress > endAddress)
    {
        uint endAddressShift = (((uint)endAddress) >> s_BitArrayCardTableShift);
        uint endAddressBitMask = 0xFFFFFFFF << endAddressShift;
        bitMask &= ~endAddressBitMask;
        cardTable[cardIndex] |= bitMask;
        return;
    }
    cardTable[cardIndex] |= bitMask;

    size_t remainingBytes = endAddress - alignedAddress;
    size_t fullMaskCount = remainingBytes  / g_WriteBarrierPageSize;
    memset(&cardTable[cardIndex + 1], 0xFFFFFFFF, fullMaskCount * sizeof(DWORD));

    uint endAddressShift = (((uint)endAddress) >> s_BitArrayCardTableShift);
    uint endAddressBitMask = 0xFFFFFFFF << endAddressShift;
    cardTable[cardIndex + 1 + fullMaskCount] |= ~endAddressBitMask;
#endif
}